

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMPTEAnalyzerResults.cpp
# Opt level: O0

void __thiscall
SMPTEAnalyzerResults::GenerateExportFile
          (SMPTEAnalyzerResults *this,char *file,DisplayBase display_base,U32 export_type_user_id)

{
  byte bVar1;
  uint uVar2;
  ulonglong uVar3;
  ostream *poVar4;
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  Frame local_3a0 [40];
  char local_378 [8];
  char str [128];
  char time_str [128];
  ulonglong local_270;
  Frame frame;
  uint local_244;
  U32 i;
  U64 num_frames;
  U32 sample_rate;
  U64 trigger_sample;
  ofstream file_stream;
  U32 export_type_user_id_local;
  DisplayBase display_base_local;
  char *file_local;
  SMPTEAnalyzerResults *this_local;
  
  std::ofstream::ofstream(&trigger_sample,file,_S_out);
  uVar3 = Analyzer::GetTriggerSample();
  uVar2 = Analyzer::GetSampleRate();
  poVar4 = std::operator<<((ostream *)&trigger_sample,"# ");
  poVar4 = std::operator<<(poVar4,"SMPTE/EBU Timecode (BiPhase Mark \'LTC\' 80 bits)");
  poVar4 = std::operator<<(poVar4," / ");
  poVar4 = std::operator<<(poVar4,"0.02 - 2011-08-19");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&trigger_sample,
                           "Time [s],SMPTE Timestamp HH:MM:SS.frame (flags)");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  uVar5 = AnalyzerResults::GetNumFrames();
  for (local_244 = 0; local_244 < uVar5; local_244 = local_244 + 1) {
    AnalyzerResults::GetFrame((ulonglong)&local_270);
    AnalyzerHelpers::GetTimeString(local_270,uVar3,uVar2,str + 0x78,0x80);
    while (sVar6 = strlen(str + 0x78), sVar6 < 9) {
      strcat(str + 0x78,"0");
    }
    Frame::Frame(local_3a0,(Frame *)&local_270);
    fillSMPTE(this,local_3a0,local_378);
    Frame::~Frame(local_3a0);
    poVar4 = std::operator<<((ostream *)&trigger_sample,str + 0x78);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = std::operator<<(poVar4,local_378);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    bVar1 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,(ulong)local_244)
    ;
    bVar7 = (bVar1 & 1) == 1;
    if (bVar7) {
      std::ofstream::close();
    }
    Frame::~Frame((Frame *)&local_270);
    if (bVar7) goto LAB_00106867;
  }
  std::ofstream::close();
LAB_00106867:
  std::ofstream::~ofstream(&trigger_sample);
  return;
}

Assistant:

void SMPTEAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 export_type_user_id )
{
	std::ofstream file_stream( file, std::ios::out );

	U64 trigger_sample = mAnalyzer->GetTriggerSample();
	U32 sample_rate = mAnalyzer->GetSampleRate();

	file_stream << "# " << TITLE << " / " << VERSION << std::endl;
	file_stream << "Time [s],SMPTE Timestamp HH:MM:SS.frame (flags)" << std::endl;

	U64 num_frames = GetNumFrames();
	for( U32 i=0; i < num_frames; i++ )
	{
		Frame frame = GetFrame( i );
		
		char time_str[128];
		AnalyzerHelpers::GetTimeString( frame.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, 128 );

		while(strlen(time_str)<9)
			strcat(time_str,"0");

		char str[128];
	        fillSMPTE(frame,str);

		file_stream << time_str << "," << str << std::endl;

		if( UpdateExportProgressAndCheckForCancel( i, num_frames ) == true )
		{
			file_stream.close();
			return;
		}
	}

	file_stream.close();
}